

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::AddOption(OptionParser *this,char *long_name,char *help,NullCallback *callback)

{
  undefined1 *puVar1;
  function<void_()> *this_00;
  undefined1 local_168 [8];
  Option option;
  undefined1 local_c8 [16];
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)&option.callback._M_invoker,long_name,&local_2a);
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::string((string *)&local_98,help,&local_29);
  std::function<void_()>::function((function<void_()> *)&local_78,callback);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,(function<void_()> *)&local_78);
  pcStack_40 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:78:17)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:78:17)>
             ::_M_manager;
  local_58._M_unused._M_object = this_00;
  Option::Option((Option *)local_168,'\0',(string *)&option.callback._M_invoker,&local_b8,No,
                 &local_98,(Callback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (option.callback._M_invoker != (_Invoker_type)local_c8) {
    operator_delete(option.callback._M_invoker);
  }
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,(Option *)local_168);
  if (option.callback.super__Function_base._M_functor._8_8_ != 0) {
    puVar1 = (undefined1 *)((long)&option.help.field_2 + 8);
    (*(code *)option.callback.super__Function_base._M_functor._8_8_)(puVar1,puVar1,3);
  }
  if ((size_type *)option._72_8_ != &option.help._M_string_length) {
    operator_delete((void *)option._72_8_);
  }
  if ((size_type *)option.long_name.field_2._8_8_ != &option.metavar._M_string_length) {
    operator_delete((void *)option.long_name.field_2._8_8_);
  }
  if ((size_type *)option._0_8_ != &option.long_name._M_string_length) {
    operator_delete((void *)option._0_8_);
  }
  return;
}

Assistant:

void OptionParser::AddOption(const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option('\0', long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}